

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O1

void __thiscall
llvm::SourceMgr::PrintMessage
          (SourceMgr *this,raw_ostream *OS,SMLoc Loc,DiagKind Kind,Twine *Msg,
          ArrayRef<llvm::SMRange> Ranges,ArrayRef<llvm::SMFixIt> FixIts,bool ShowColors)

{
  SMDiagnostic local_188;
  
  GetMessage(&local_188,this,Loc,Kind,Msg,Ranges,FixIts);
  PrintMessage(this,OS,&local_188,ShowColors);
  SmallVector<llvm::SMFixIt,_4U>::~SmallVector(&local_188.FixIts);
  if (local_188.Ranges.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.Ranges.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.Ranges.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.Ranges.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.LineContents._M_dataplus._M_p != &local_188.LineContents.field_2) {
    operator_delete(local_188.LineContents._M_dataplus._M_p,
                    local_188.LineContents.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.Message._M_dataplus._M_p != &local_188.Message.field_2) {
    operator_delete(local_188.Message._M_dataplus._M_p,
                    local_188.Message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.Filename._M_dataplus._M_p != &local_188.Filename.field_2) {
    operator_delete(local_188.Filename._M_dataplus._M_p,
                    local_188.Filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SourceMgr::PrintMessage(raw_ostream &OS, SMLoc Loc,
                             SourceMgr::DiagKind Kind,
                             const Twine &Msg, ArrayRef<SMRange> Ranges,
                             ArrayRef<SMFixIt> FixIts, bool ShowColors) const {
  PrintMessage(OS, GetMessage(Loc, Kind, Msg, Ranges, FixIts), ShowColors);
}